

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urandom.cc
# Opt level: O0

int CRYPTO_sysrand_if_available(uint8_t *out,size_t requested)

{
  int iVar1;
  int *piVar2;
  size_t requested_local;
  uint8_t *out_local;
  
  iVar1 = fill_with_entropy(out,requested,0,0);
  if (iVar1 == 0) {
    piVar2 = __errno_location();
    if (*piVar2 != 0xb) {
      perror("opportunistic entropy fill failed");
      abort();
    }
    OPENSSL_memset(out,0,requested);
    out_local._4_4_ = 0;
  }
  else {
    out_local._4_4_ = 1;
  }
  return out_local._4_4_;
}

Assistant:

int CRYPTO_sysrand_if_available(uint8_t *out, size_t requested) {
  if (fill_with_entropy(out, requested, /*block=*/0, /*seed=*/0)) {
    return 1;
  } else if (errno == EAGAIN) {
    OPENSSL_memset(out, 0, requested);
    return 0;
  } else {
    perror("opportunistic entropy fill failed");
    abort();
  }
}